

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

void cmCacheManager::OutputNewlineTruncationWarning
               (ostream *fout,string *key,string *value,cmMessenger *messenger)

{
  long lVar1;
  string comment;
  cmListFileBacktrace local_38;
  
  lVar1 = std::__cxx11::string::find((char)value,10);
  if (lVar1 != -1) {
    if (messenger != (cmMessenger *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&comment,"Value of ",(allocator<char> *)&local_38);
      std::__cxx11::string::append((string *)&comment);
      std::__cxx11::string::append((char *)&comment);
      local_38.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_38.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmMessenger::IssueMessage(messenger,WARNING,&comment,&local_38);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_38.TopEntry.
                  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string((string *)&comment);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&comment,"WARNING: Value of ",(allocator<char> *)&local_38);
    std::__cxx11::string::append((string *)&comment);
    std::__cxx11::string::append((char *)&comment);
    OutputWarningComment(fout,&comment,true);
    OutputWarningComment(fout,value,false);
    std::__cxx11::string::~string((string *)&comment);
  }
  return;
}

Assistant:

void cmCacheManager::OutputNewlineTruncationWarning(std::ostream& fout,
                                                    std::string const& key,
                                                    std::string const& value,
                                                    cmMessenger* messenger)
{
  if (value.find('\n') != std::string::npos) {
    if (messenger) {
      std::string message = "Value of ";
      message += key;
      message += " contained a newline; truncating";
      messenger->IssueMessage(MessageType::WARNING, message);
    }

    std::string comment = "WARNING: Value of ";
    comment += key;
    comment += " contained a newline and was truncated. Original value:";

    OutputWarningComment(fout, comment, true);
    OutputWarningComment(fout, value, false);
  }
}